

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

Mutex * __thiscall absl::lts_20240722::flags_internal::FlagImpl::DataGuard(FlagImpl *this)

{
  FlagImpl *local_20;
  code *local_18;
  undefined8 local_10;
  
  local_18 = Init;
  local_10 = 0;
  if ((this->init_control_).control_.super___atomic_base<unsigned_int>._M_i != 0xdd) {
    local_20 = this;
    base_internal::
    CallOnceImpl<void(absl::lts_20240722::flags_internal::FlagImpl::*)(),absl::lts_20240722::flags_internal::FlagImpl*>
              (&(this->init_control_).control_,SCHEDULE_COOPERATIVE_AND_KERNEL,
               (offset_in_FlagImpl_to_subr *)&local_18,&local_20);
  }
  return (Mutex *)this->data_guard_;
}

Assistant:

absl::Mutex* FlagImpl::DataGuard() const {
  absl::call_once(const_cast<FlagImpl*>(this)->init_control_, &FlagImpl::Init,
                  const_cast<FlagImpl*>(this));

  // data_guard_ is initialized inside Init.
  return reinterpret_cast<absl::Mutex*>(&data_guard_);
}